

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_utility.c
# Opt level: O1

uint TA_GetUnstablePeriod(TA_FuncUnstId id)

{
  uint uVar1;
  
  uVar1 = 0;
  if (id < TA_FUNC_UNST_ALL) {
    uVar1 = TA_Globals->unstablePeriod[id];
  }
  return uVar1;
}

Assistant:

unsigned int TA_GetUnstablePeriod( TA_FuncUnstId id )
#endif
{
   if( id >= ENUM_VALUE(FuncUnstId,TA_FUNC_UNST_ALL,FuncUnstAll) )
	   return 0;

   #if defined( _MANAGED )
      return Globals->unstablePeriod[(int)id];
   #else
      return TA_Globals->unstablePeriod[id];
   #endif
}